

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

JavascriptFunction *
Js::JavascriptExceptionOperators::WalkStackForExceptionContextInternal
          (ScriptContext *scriptContext,JavascriptExceptionContext *exceptionContext,
          Var thrownObject,uint32 *callerByteCodeOffset,uint64 stackCrawlLimit,PVOID returnAddress,
          bool isThrownException,bool resetStack)

{
  size_t *this;
  Type *pTVar1;
  Type *addr;
  Type pRVar2;
  JavascriptExceptionObject *pJVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  uint32 uVar7;
  int iVar8;
  undefined4 *puVar9;
  Recycler *alloc;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  JavascriptError *pJVar10;
  JavascriptFunction *this_01;
  ulong uVar11;
  byte initArgumentTypes;
  bool bVar12;
  undefined1 local_128 [8];
  JavascriptStackWalker walker;
  TrackAllocData data;
  AutoNestedHandledExceptionType local_4c;
  JavascriptFunction *pJStack_48;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  JavascriptFunction *jsFunc;
  
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_128,scriptContext,true,returnAddress,false);
  pJStack_48 = (JavascriptFunction *)0x0;
  BVar6 = GetCaller((JavascriptStackWalker *)local_128,&stack0xffffffffffffffb8);
  if (BVar6 == 0) {
LAB_00aa2f7a:
    this_01 = (JavascriptFunction *)0x0;
    goto LAB_00aa3106;
  }
  bVar5 = JavascriptFunction::IsLibraryCode(pJStack_48);
  if (bVar5) {
    BVar6 = JavascriptStackWalker::GetNonLibraryCodeCaller
                      ((JavascriptStackWalker *)local_128,&stack0xffffffffffffffb8);
    if (BVar6 == 0) goto LAB_00aa2f7a;
  }
  this_01 = pJStack_48;
  uVar7 = JavascriptStackWalker::GetByteCodeOffset((JavascriptStackWalker *)local_128);
  *callerByteCodeOffset = uVar7;
  bVar5 = JavascriptFunction::IsLibraryCode(this_01);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x472,"(!caller->IsLibraryCode())","!caller->IsLibraryCode()");
    if (!bVar5) goto LAB_00aa32c8;
    *puVar9 = 0;
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_4c,
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  walker.currentFrame.stackCheckCodeHeight =
       (size_t)&JsUtil::
                List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
  alloc = Memory::Recycler::TrackAllocInfo
                    (scriptContext->recycler,
                     (TrackAllocData *)&walker.currentFrame.stackCheckCodeHeight);
  this_00 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  pRVar2 = scriptContext->recycler;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .buffer.ptr = (StackFrame *)0x0;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .count = 0;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  .alloc = pRVar2;
  (this_00->
  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>)
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ffb98;
  this_00->length = 0;
  this_00->increment = 4;
  if (stackCrawlLimit != 0) {
    if (DAT_015d3474 == '\x01') {
      initArgumentTypes = scriptContext->threadContext->hasCatchHandler ^ 1;
    }
    else {
      initArgumentTypes = false;
    }
    if ((thrownObject != (Var)0x0) && ((bool)initArgumentTypes != false)) {
      bVar5 = VarIs<Js::JavascriptError>(thrownObject);
      if (bVar5) {
        pJVar10 = VarTo<Js::JavascriptError>(thrownObject);
        walker.currentFrame.stackCheckCodeHeight = 0;
        pJVar3 = (pJVar10->exceptionObject).ptr;
        if (!resetStack) {
          iVar8 = (*(pJVar10->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                            (pJVar10,pJVar10,5,&walker.currentFrame.stackCheckCodeHeight,0,
                             scriptContext);
          if (walker.currentFrame.stackCheckCodeHeight != 0 && iVar8 != 0) {
            JavascriptExceptionContext::SetOriginalStackTrace
                      (exceptionContext,(StackTrace *)walker.currentFrame.stackCheckCodeHeight);
            goto LAB_00aa3008;
          }
        }
        if (pJVar3 != (JavascriptExceptionObject *)0x0) {
          JavascriptExceptionContext::SetOriginalStackTrace
                    (exceptionContext,(pJVar3->exceptionContext).m_stackTrace.ptr);
        }
      }
    }
LAB_00aa3008:
    uVar11 = 1;
    this = &walker.currentFrame.stackCheckCodeHeight;
    do {
      JavascriptExceptionContext::StackFrame::StackFrame
                ((StackFrame *)this,pJStack_48,(JavascriptStackWalker *)local_128,
                 (bool)initArgumentTypes);
      JsUtil::
      List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray(this_00,0);
      JavascriptExceptionContext::StackFrame::operator=
                ((this_00->
                 super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr +
                 (this_00->
                 super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                 ).count,(StackFrame *)this);
      pTVar1 = &(this_00->
                super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                ).count;
      *pTVar1 = *pTVar1 + 1;
      bVar5 = JavascriptStackWalker::GetDisplayCaller
                        ((JavascriptStackWalker *)local_128,&stack0xffffffffffffffb8);
      bVar12 = uVar11 < stackCrawlLimit;
      uVar11 = uVar11 + 1;
    } while (bVar5 && bVar12);
  }
  BVar6 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x49d,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                       "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar5) {
LAB_00aa32c8:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
  if (this_00 !=
      (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    addr = &exceptionContext->m_stackTrace;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    DumpStackTrace(exceptionContext,isThrownException);
  }
LAB_00aa3106:
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_128);
  return this_01;
}

Assistant:

JavascriptFunction *
    JavascriptExceptionOperators::WalkStackForExceptionContextInternal(ScriptContext& scriptContext, JavascriptExceptionContext& exceptionContext, Var thrownObject,
        uint32& callerByteCodeOffset, uint64 stackCrawlLimit, PVOID returnAddress, bool isThrownException, bool resetStack)
    {
        JavascriptStackWalker walker(&scriptContext, true, returnAddress);
        JavascriptFunction* jsFunc = nullptr;

        if (!GetCaller(walker, jsFunc))
        {
            return nullptr;
        }

        // Skip to first non-Library code
        // Similar behavior to GetCaller returning false
        if(jsFunc->IsLibraryCode() && !walker.GetNonLibraryCodeCaller(&jsFunc))
        {
            return nullptr;
        }

        JavascriptFunction * caller = jsFunc;
        callerByteCodeOffset = walker.GetByteCodeOffset();

        Assert(!caller->IsLibraryCode());
        // NOTE Don't set the throwing exception here, because we might need to box it and will cause a nested stack walker
        // instead, return it to be set in WalkStackForExceptionContext

        JavascriptExceptionContext::StackTrace *stackTrace = nullptr;
        // If we take an OOM (JavascriptException for OOM if script is active), just bail early and return what we've got
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            stackTrace = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
            if (stackCrawlLimit > 0)
            {
                const bool crawlStackForWER = CrawlStackForWER(scriptContext);

                // In WER scenario, we should combine the original stack with latest throw stack as the final throw might be coming form
                // a different stack.
                uint64 i = 1;
                if (crawlStackForWER && thrownObject && Js::VarIs<Js::JavascriptError>(thrownObject))
                {
                    Js::JavascriptError* errorObject = Js::VarTo<Js::JavascriptError>(thrownObject);
                    Js::JavascriptExceptionContext::StackTrace *originalStackTrace = NULL;
                    const Js::JavascriptExceptionObject* originalExceptionObject = errorObject->GetJavascriptExceptionObject();
                    if (!resetStack && errorObject->GetInternalProperty(errorObject, InternalPropertyIds::StackTrace, (Js::Var*) &originalStackTrace, NULL, &scriptContext) &&
                        (originalStackTrace != nullptr))
                    {
                        exceptionContext.SetOriginalStackTrace(originalStackTrace);
                    }
                    else
                    {
                        if (originalExceptionObject != nullptr)
                        {
                            exceptionContext.SetOriginalStackTrace(originalExceptionObject->GetExceptionContext()->GetStackTrace());
                        }
                    }
                }

                do
                {
                    JavascriptExceptionContext::StackFrame stackFrame(jsFunc, walker, crawlStackForWER);
                    stackTrace->Add(stackFrame);
                } while (walker.GetDisplayCaller(&jsFunc) && i++ < stackCrawlLimit);
            }
        }